

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

int downsample(double *x,int lenx,int M,double *y)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  if (-1 < M) {
    if (M == 0) {
      uVar2 = 0;
      uVar3 = 0;
      if (0 < lenx) {
        uVar3 = (ulong)(uint)lenx;
      }
      for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        y[uVar2] = x[uVar2];
      }
    }
    else {
      iVar1 = (lenx + -1) / M;
      for (lVar4 = 0; lVar4 <= iVar1; lVar4 = lVar4 + 1) {
        y[lVar4] = *x;
        x = x + (uint)M;
      }
      lenx = iVar1 + 1;
    }
    return lenx;
  }
  return -1;
}

Assistant:

int downsample(double *x,int lenx, int M, double *y) {
	int N,i;

	if (M < 0) {
		return -1;
	}
	if (M == 0) {
		for (i = 0; i < lenx; ++i) {
			y[i] = x[i];
		}
		return lenx;
	}

	N = (lenx-1)/M + 1;

	for (i = 0;i < N;++i) {
		y[i] = x[i*M];
	}

	return N;
}